

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTemp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  
  iVar1 = vTemp->nSize;
  if (iVar1 != p->nObjs) {
    __assert_fail("Vec_WrdSize(vTemp) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                  ,0x7d,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
  }
  if (-1 < iObj) {
    uVar2 = p->vMapping->nSize;
    if (iObj < (int)uVar2) {
      piVar5 = p->vMapping->pArray;
      uVar3 = piVar5[(uint)iObj];
      uVar6 = (ulong)uVar3;
      if (uVar6 == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                      ,0x7e,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
      }
      if ((-1 < (int)uVar3) && (uVar3 < uVar2)) {
        uVar2 = piVar5[uVar6];
        if (0 < (int)uVar2) {
          piVar5 = piVar5 + uVar6;
          lVar7 = 0;
          do {
            piVar5 = piVar5 + 1;
            iVar4 = *piVar5;
            if (((long)iVar4 < 0) || (iVar1 <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
            }
            vTemp->pArray[iVar4] = *(word *)((long)s_Truths6 + lVar7);
            lVar7 = lVar7 + 8;
          } while ((ulong)uVar2 * 8 != lVar7);
        }
        if (6 < (int)uVar2) {
          __assert_fail("i <= 6",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTruth.c"
                        ,0x81,"word Gia_ObjComputeTruthTable6Lut(Gia_Man_t *, int, Vec_Wrd_t *)");
        }
        Gia_ObjComputeTruthTable6Lut_rec(p,iObj,vTemp);
        if (vTemp->nSize <= iObj) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        return vTemp->pArray[(uint)iObj];
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Gia_ObjComputeTruthTable6Lut( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTemp )
{
    int i, Fanin;
    assert( Vec_WrdSize(vTemp) == Gia_ManObjNum(p) );
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_LutForEachFanin( p, iObj, Fanin, i )
        Vec_WrdWriteEntry( vTemp, Fanin, s_Truth6[i] );
    assert( i <= 6 );
    Gia_ObjComputeTruthTable6Lut_rec( p, iObj, vTemp );
    return Vec_WrdEntry( vTemp, iObj );
}